

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::objectivec::FieldGeneratorMap::FieldGeneratorMap
          (FieldGeneratorMap *this,Descriptor *descriptor,Options *options)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong *puVar6;
  scoped_ptr<google::protobuf::compiler::objectivec::FieldGenerator> *psVar7;
  FieldDescriptor *pFVar8;
  FieldGenerator *pFVar9;
  ulong uVar10;
  scoped_ptr<google::protobuf::compiler::objectivec::FieldGenerator> *local_b8;
  scoped_ptr<google::protobuf::compiler::objectivec::FieldGenerator> *local_70;
  int local_34;
  int local_30;
  int i_1;
  int i;
  Options *options_local;
  Descriptor *descriptor_local;
  FieldGeneratorMap *this_local;
  
  this->descriptor_ = descriptor;
  iVar3 = Descriptor::field_count(descriptor);
  uVar4 = (ulong)iVar3;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar4;
  uVar5 = SUB168(auVar1 * ZEXT816(8),0);
  uVar10 = uVar5 + 8;
  if (SUB168(auVar1 * ZEXT816(8),8) != 0 || 0xfffffffffffffff7 < uVar5) {
    uVar10 = 0xffffffffffffffff;
  }
  puVar6 = (ulong *)operator_new__(uVar10);
  *puVar6 = uVar4;
  psVar7 = (scoped_ptr<google::protobuf::compiler::objectivec::FieldGenerator> *)(puVar6 + 1);
  if (uVar4 != 0) {
    local_70 = psVar7;
    do {
      internal::scoped_ptr<google::protobuf::compiler::objectivec::FieldGenerator>::scoped_ptr
                (local_70,(FieldGenerator *)0x0);
      local_70 = local_70 + 1;
    } while (local_70 != psVar7 + uVar4);
  }
  internal::
  scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::objectivec::FieldGenerator>_>
  ::scoped_array(&this->field_generators_,psVar7);
  iVar3 = Descriptor::extension_count(descriptor);
  uVar4 = (ulong)iVar3;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar4;
  uVar5 = SUB168(auVar2 * ZEXT816(8),0);
  uVar10 = uVar5 + 8;
  if (0xfffffffffffffff7 < uVar5) {
    uVar10 = 0xffffffffffffffff;
  }
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar10 = 0xffffffffffffffff;
  }
  puVar6 = (ulong *)operator_new__(uVar10);
  *puVar6 = uVar4;
  psVar7 = (scoped_ptr<google::protobuf::compiler::objectivec::FieldGenerator> *)(puVar6 + 1);
  if (uVar4 != 0) {
    local_b8 = psVar7;
    do {
      internal::scoped_ptr<google::protobuf::compiler::objectivec::FieldGenerator>::scoped_ptr
                (local_b8,(FieldGenerator *)0x0);
      local_b8 = local_b8 + 1;
    } while (local_b8 != psVar7 + uVar4);
  }
  internal::
  scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::objectivec::FieldGenerator>_>
  ::scoped_array(&this->extension_generators_,psVar7);
  local_30 = 0;
  while( true ) {
    iVar3 = Descriptor::field_count(descriptor);
    if (iVar3 <= local_30) break;
    psVar7 = internal::
             scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::objectivec::FieldGenerator>_>
             ::operator[](&this->field_generators_,(long)local_30);
    pFVar8 = Descriptor::field(descriptor,local_30);
    pFVar9 = FieldGenerator::Make(pFVar8,options);
    internal::scoped_ptr<google::protobuf::compiler::objectivec::FieldGenerator>::reset
              (psVar7,pFVar9);
    local_30 = local_30 + 1;
  }
  local_34 = 0;
  while( true ) {
    iVar3 = Descriptor::extension_count(descriptor);
    if (iVar3 <= local_34) break;
    psVar7 = internal::
             scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::objectivec::FieldGenerator>_>
             ::operator[](&this->extension_generators_,(long)local_34);
    pFVar8 = Descriptor::extension(descriptor,local_34);
    pFVar9 = FieldGenerator::Make(pFVar8,options);
    internal::scoped_ptr<google::protobuf::compiler::objectivec::FieldGenerator>::reset
              (psVar7,pFVar9);
    local_34 = local_34 + 1;
  }
  return;
}

Assistant:

FieldGeneratorMap::FieldGeneratorMap(const Descriptor* descriptor,
                                     const Options& options)
    : descriptor_(descriptor),
      field_generators_(
          new scoped_ptr<FieldGenerator>[descriptor->field_count()]),
      extension_generators_(
          new scoped_ptr<FieldGenerator>[descriptor->extension_count()]) {
  // Construct all the FieldGenerators.
  for (int i = 0; i < descriptor->field_count(); i++) {
    field_generators_[i].reset(
        FieldGenerator::Make(descriptor->field(i), options));
  }
  for (int i = 0; i < descriptor->extension_count(); i++) {
    extension_generators_[i].reset(
        FieldGenerator::Make(descriptor->extension(i), options));
  }
}